

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sprites.c
# Opt level: O1

void dw4_yeti(dw_rom *rom)

{
  vpatch(rom,0x13b4,0x50,0x50,2,0x51,2,0x52,2,0x53,2,0x54,2,0x55,2,0x56,2,0x57,2,0x50,2,0x51,2,0x52,
         2,0x53,2,0x54,2,0x55,2,0x56,2,0x57,2,0x50,2,0x51,2,0x52,2,0x53,2,0x54,2,0x55,2,0x56,2,0x57,
         2,0x50,2,0x51,2,0x52,2,0x53,2,0x54,2,0x55,2,0x56,2,0x57,2,0x50);
  vpatch(rom,0x14b4,0x4e,0x48,2,0x49,2,0x4a,2,0x4b,2,0x4c,2,0x4d,2,0x4e,2,0x4f,2,0x48,2,0x49,2,0x4a,
         2,0x4b,2,0x4c,2,0x4d,2,0x4e,2,0x4f,2,0x48,2,0x49,2,0x4a,2,0x4b,2,0x4c,2,0x4d,2,0x4e,2,0x4f,
         2,0x48,2,0x49,2,0x4a,2,0x4b,2,0x4c,2,0x4d,2,0x4e,2,0x4f,2,0x48);
  vpatch(rom,0x15b4,0x44,0x30,2,0x31,2,0x32,2,0x33,2,0x34,2,0x35,2,0x36,2,0x37,2,0x30,2,0x31,2,0x32,
         2,0x33,2,0x34,2,0x35,2,0x36,2,0x37,2,0x30,2,0x31,2,0x32,2,0x33,2,0x34,2,0x35,2,0x36,2,0x37,
         2,0x30,2,0x31,2,0x32,2,0x33,2,0x34,2,0x35,2,0x36,2,0x37,2,0xb4);
  vpatch(rom,0x15fe,2,0x35,2);
  vpatch(rom,0x16b4,0x44,0x40,2,0x41,2,0x42,2,0x43,2,0x44,2,0x45,2,0x46,2,0x47,2,0x40,2,0x41,2,0x42,
         2,0x43,2,0x44,2,0x45,2,0x46,2,0x47,2,0x40,2,0x41,2,0x42,2,0x43,2,0x44,2,0x45,2,0x46,2,0x47,
         2,0x40,2,0x41,2,0x42,2,0x43,2,0x44,2,0x45,2,0x46,2,0x47,2,0xb8);
  vpatch(rom,0x16fe,2,0x45,2);
  vpatch(rom,0x1a8d,7,0x11,0x35,0x27,0x1a,0x27,0x20,0x18);
  vpatch(rom,0x12300,0x80,0,0,0,2,5,2,0,6,0xb,7,0x1f,0xf,0x1f,0x1f,0x3f,0xff,0,0,0,0x40,0xa0,0x40,0,
         0x60,0xd0,0xe0,0xf8,0xf0,0xf8,0xf8,0xfc,0xfe,7,99,99,3,1,0,0,0,0xff,0xfe,0x7e,0x3e,0x3f,
         0x1f,0xf,0,0xe0,0xc0,0xc0,0xc6,0x86,0,0xe0,0x50,0xfe,0x7f,0x7f,0x7f,0xfe,0xf8,0xf0,0x50,0);
  vpatch(rom,0x12400,0x180,0,0,0,0xc,0x16,0xc,0,0xc,3,7,0xf,0xf,0x1f,0x1f,0x1f,0x3f,0,0,0,0,0,0,0,0,
         0xe8,0xf0,0xfc,0xf8,0xfc,0xf8,0xfc,0xfe,0x3c,0x38,0x70,0x70,0x60,0,7,0x1f,0x3f,0xf,0x1f,
         0x1f,0x7f,0x1f,0xf,0x1f,0,0,0x18,0x18,0,0,0,0x80,0xff,0xff,0xff,0xfe,0xfc,0xfc,0xf8,0x80,0)
  ;
  vpatch(rom,0x12b22,0xe,0x70,0x68,1,0,7,10,0xfe,0xf8,0xff,0x7f,0x1f,0x1f,0xf,10);
  vpatch(rom,0x12b37,1,0);
  vpatch(rom,0x12b3d,3,0xfe,0xfc,0);
  vpatch(rom,0x12b60,0x10,0xe3,0x67,0x70,8,1,0,0,0,0xfe,0x78,0x7f,0x3f,0x3f,0x1f,0xf,0);
  vpatch(rom,0x12b75,3,8,0x90,0x50);
  vpatch(rom,0x12b7d,3,0xfe,0xfc,0x50);
  vpatch(rom,0x12ba7,1,0xf);
  vpatch(rom,0x12bae,2,7,0xf);
  vpatch(rom,0x12bb7,1,0xc0);
  vpatch(rom,0x12bbf,1,0xc0);
  vpatch(rom,0x12be6,2,0,1);
  vpatch(rom,0x12bed,3,0x1f,0xf,1);
  vpatch(rom,0x12bf6,2,0x70,0xf8);
  vpatch(rom,0x12bfe,2,0xf8,0xf8);
  return;
}

Assistant:

static void dw4_yeti(dw_rom *rom)
{
    vpatch(rom, 0x013b4,   80,  0x50,  0x02,  0x51,  0x02,  0x52,  0x02,  0x53,  0x02,  0x54,  0x02,  0x55,  0x02,  0x56,  0x02,  0x57,  0x02,  0x50,  0x02,  0x51,  0x02,  0x52,  0x02,  0x53,  0x02,  0x54,  0x02,  0x55,  0x02,  0x56,  0x02,  0x57,  0x02,  0x50,  0x02,  0x51,  0x02,  0x52,  0x02,  0x53,  0x02,  0x54,  0x02,  0x55,  0x02,  0x56,  0x02,  0x57,  0x02,  0x50,  0x02,  0x51,  0x02,  0x52,  0x02,  0x53,  0x02,  0x54,  0x02,  0x55,  0x02,  0x56,  0x02,  0x57,  0x02,  0x50,  0x02,  0x51,  0x02,  0x52,  0x02,  0x53,  0x02,  0x54,  0x02,  0x55,  0x02,  0x56,  0x02,  0x57,  0x02);
    vpatch(rom, 0x014b4,   78,  0x48,  0x02,  0x49,  0x02,  0x4a,  0x02,  0x4b,  0x02,  0x4c,  0x02,  0x4d,  0x02,  0x4e,  0x02,  0x4f,  0x02,  0x48,  0x02,  0x49,  0x02,  0x4a,  0x02,  0x4b,  0x02,  0x4c,  0x02,  0x4d,  0x02,  0x4e,  0x02,  0x4f,  0x02,  0x48,  0x02,  0x49,  0x02,  0x4a,  0x02,  0x4b,  0x02,  0x4c,  0x02,  0x4d,  0x02,  0x4e,  0x02,  0x4f,  0x02,  0x48,  0x02,  0x49,  0x02,  0x4a,  0x02,  0x4b,  0x02,  0x4c,  0x02,  0x4d,  0x02,  0x4e,  0x02,  0x4f,  0x02,  0x48,  0x02,  0xa9,  0x03,  0x4a,  0x02,  0xab,  0x03,  0x4c,  0x02,  0xad,  0x03,  0x4e,  0x02);
    vpatch(rom, 0x015b4,   68,  0x30,  0x02,  0x31,  0x02,  0x32,  0x02,  0x33,  0x02,  0x34,  0x02,  0x35,  0x02,  0x36,  0x02,  0x37,  0x02,  0x30,  0x02,  0x31,  0x02,  0x32,  0x02,  0x33,  0x02,  0x34,  0x02,  0x35,  0x02,  0x36,  0x02,  0x37,  0x02,  0x30,  0x02,  0x31,  0x02,  0x32,  0x02,  0x33,  0x02,  0x34,  0x02,  0x35,  0x02,  0x36,  0x02,  0x37,  0x02,  0x30,  0x02,  0x31,  0x02,  0x32,  0x02,  0x33,  0x02,  0x34,  0x02,  0x35,  0x02,  0x36,  0x02,  0x37,  0x02,  0xb4,  0x03,  0x31,  0x02);
    vpatch(rom, 0x015fe,    2,  0x35,  0x02);
    vpatch(rom, 0x016b4,   68,  0x40,  0x02,  0x41,  0x02,  0x42,  0x02,  0x43,  0x02,  0x44,  0x02,  0x45,  0x02,  0x46,  0x02,  0x47,  0x02,  0x40,  0x02,  0x41,  0x02,  0x42,  0x02,  0x43,  0x02,  0x44,  0x02,  0x45,  0x02,  0x46,  0x02,  0x47,  0x02,  0x40,  0x02,  0x41,  0x02,  0x42,  0x02,  0x43,  0x02,  0x44,  0x02,  0x45,  0x02,  0x46,  0x02,  0x47,  0x02,  0x40,  0x02,  0x41,  0x02,  0x42,  0x02,  0x43,  0x02,  0x44,  0x02,  0x45,  0x02,  0x46,  0x02,  0x47,  0x02,  0xb8,  0x03,  0x41,  0x02);
    vpatch(rom, 0x016fe,    2,  0x45,  0x02);
    vpatch(rom, 0x01a8d,    7,  0x11,  0x35,  0x27,  0x1a,  0x27,  0x20,  0x18);
    vpatch(rom, 0x12300,  128,  0x00,  0x00,  0x00,  0x02,  0x05,  0x02,  0x00,  0x06,  0x0b,  0x07,  0x1f,  0x0f,  0x1f,  0x1f,  0x3f,  0xff,  0x00,  0x00,  0x00,  0x40,  0xa0,  0x40,  0x00,  0x60,  0xd0,  0xe0,  0xf8,  0xf0,  0xf8,  0xf8,  0xfc,  0xfe,  0x07,  0x63,  0x63,  0x03,  0x01,  0x00,  0x00,  0x00,  0xff,  0xfe,  0x7e,  0x3e,  0x3f,  0x1f,  0x0f,  0x00,  0xe0,  0xc0,  0xc0,  0xc6,  0x86,  0x00,  0xe0,  0x50,  0xfe,  0x7f,  0x7f,  0x7f,  0xfe,  0xf8,  0xf0,  0x50,  0x00,  0x00,  0x00,  0x02,  0x05,  0x02,  0x00,  0x06,  0x0b,  0x07,  0x1f,  0x0f,  0x1f,  0x1f,  0x3f,  0x7f,  0x00,  0x00,  0x00,  0x40,  0xa0,  0x40,  0x00,  0x60,  0xd0,  0xe0,  0xf8,  0xf0,  0xf8,  0xf8,  0xfc,  0xfe,  0x07,  0x03,  0x03,  0x63,  0x61,  0x00,  0x07,  0x0a,  0x7f,  0xfe,  0xfe,  0xfe,  0x7f,  0x1f,  0x0f,  0x0a,  0xe0,  0xc6,  0xc6,  0xc0,  0x80,  0x00,  0x00,  0x00,  0xff,  0x7f,  0x7e,  0x7c,  0xfc,  0xf8,  0xf0,  0x00);
    vpatch(rom, 0x12400,  384,  0x00,  0x00,  0x00,  0x0c,  0x16,  0x0c,  0x00,  0x0c,  0x03,  0x07,  0x0f,  0x0f,  0x1f,  0x1f,  0x1f,  0x3f,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0xe8,  0xf0,  0xfc,  0xf8,  0xfc,  0xf8,  0xfc,  0xfe,  0x3c,  0x38,  0x70,  0x70,  0x60,  0x00,  0x07,  0x1f,  0x3f,  0x0f,  0x1f,  0x1f,  0x7f,  0x1f,  0x0f,  0x1f,  0x00,  0x00,  0x18,  0x18,  0x00,  0x00,  0x00,  0x80,  0xff,  0xff,  0xff,  0xfe,  0xfc,  0xfc,  0xf8,  0x80,  0x00,  0x00,  0x00,  0x0c,  0x16,  0x0c,  0x00,  0x0c,  0x03,  0x07,  0x0f,  0x0f,  0x1f,  0x1f,  0x1f,  0x3f,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0xe8,  0xf0,  0xfc,  0xf8,  0xfc,  0xf8,  0xfc,  0xfe,  0x3c,  0x38,  0x70,  0x70,  0x60,  0x00,  0x00,  0x01,  0x3f,  0x0f,  0x1f,  0x1f,  0x7f,  0x1f,  0x0f,  0x01,  0xc0,  0xc0,  0x00,  0x00,  0x00,  0x00,  0x70,  0xf8,  0xfe,  0xfe,  0xfe,  0xfe,  0xfc,  0xfc,  0xf8,  0xf8,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x17,  0x0f,  0x3f,  0x1f,  0x3f,  0x1f,  0x3f,  0x7f,  0x00,  0x00,  0x00,  0x30,  0x68,  0x30,  0x00,  0x30,  0xc0,  0xe0,  0xf0,  0xf0,  0xf8,  0xf8,  0xf8,  0xfc,  0x03,  0x03,  0x00,  0x00,  0x00,  0x00,  0x0e,  0x1f,  0x7f,  0x7f,  0x7f,  0x7f,  0x3f,  0x3f,  0x1f,  0x1f,  0x3c,  0x1c,  0x0e,  0x0e,  0x06,  0x00,  0x00,  0x80,  0xfc,  0xf0,  0xf8,  0xf8,  0xfe,  0xf8,  0xf0,  0x80,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x17,  0x0f,  0x3f,  0x1f,  0x3f,  0x1f,  0x3f,  0x7f,  0x00,  0x00,  0x00,  0x30,  0x68,  0x30,  0x00,  0x30,  0xc0,  0xe0,  0xf0,  0xf0,  0xf8,  0xf8,  0xf8,  0xfc,  0x00,  0x00,  0x18,  0x18,  0x00,  0x00,  0x00,  0x01,  0xff,  0xff,  0xff,  0x7f,  0x3f,  0x3f,  0x1f,  0x01,  0x3c,  0x1c,  0x0e,  0x0e,  0x06,  0x00,  0xe0,  0xf8,  0xfc,  0xf0,  0xf8,  0xf8,  0xfe,  0xf8,  0xf0,  0xf8,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x0b,  0x07,  0x1f,  0x0f,  0x1f,  0x1f,  0x3f,  0x7f,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0xd0,  0xe0,  0xf8,  0xf0,  0xf8,  0xf8,  0xfc,  0xfe,  0x00,  0x00,  0x00,  0x60,  0x60,  0x00,  0x00,  0x00,  0x7f,  0xff,  0xff,  0x9f,  0x1f,  0x1f,  0x0f,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0xe0,  0x50,  0xff,  0xff,  0xfe,  0xfc,  0xfc,  0xf8,  0x10,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x0b,  0x07,  0x1f,  0x0f,  0x1f,  0x1f,  0x3f,  0x7f,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0xd0,  0xe0,  0xf8,  0xf0,  0xf8,  0xf8,  0xfc,  0xfe,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x07,  0x0a,  0xff,  0xff,  0x7f,  0x3f,  0x3f,  0x1f,  0x08,  0x00,  0x00,  0x00,  0x00,  0x06,  0x06,  0x00,  0x00,  0x00,  0xfe,  0xff,  0xff,  0xf9,  0xf8,  0xf8,  0xf0,  0x00);
    vpatch(rom, 0x12b22,   14,  0x70,  0x68,  0x01,  0x00,  0x07,  0x0a,  0xfe,  0xf8,  0xff,  0x7f,  0x1f,  0x1f,  0x0f,  0x0a);
    vpatch(rom, 0x12b37,    1,  0x00);
    vpatch(rom, 0x12b3d,    3,  0xfe,  0xfc,  0x00);
    vpatch(rom, 0x12b60,   16,  0xe3,  0x67,  0x70,  0x08,  0x01,  0x00,  0x00,  0x00,  0xfe,  0x78,  0x7f,  0x3f,  0x3f,  0x1f,  0x0f,  0x00);
    vpatch(rom, 0x12b75,    3,  0x08,  0x90,  0x50);
    vpatch(rom, 0x12b7d,    3,  0xfe,  0xfc,  0x50);
    vpatch(rom, 0x12ba7,    1,  0x0f);
    vpatch(rom, 0x12bae,    2,  0x07,  0x0f);
    vpatch(rom, 0x12bb7,    1,  0xc0);
    vpatch(rom, 0x12bbf,    1,  0xc0);
    vpatch(rom, 0x12be6,    2,  0x00,  0x01);
    vpatch(rom, 0x12bed,    3,  0x1f,  0x0f,  0x01);
    vpatch(rom, 0x12bf6,    2,  0x70,  0xf8);
    vpatch(rom, 0x12bfe,    2,  0xf8,  0xf8);
}